

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O0

void flatbuffers::tests::MiniReflectFixedLengthArrayTest(void)

{
  Offset<MyGame::Example::ArrayTable> root;
  size_t buffer_minalign;
  uint8_t *buffer;
  TypeTable *type_table;
  char *val;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  string s;
  DetachedBuffer flatbuf;
  Offset<MyGame::Example::ArrayTable> aTable;
  undefined1 local_128 [8];
  ArrayStruct aStruct;
  FlatBufferBuilder fbb;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)(aStruct.f_ + 1),0x400,(Allocator *)0x0,false,
             buffer_minalign);
  MyGame::Example::ArrayStruct::ArrayStruct((ArrayStruct *)local_128,2.0,'\f',1);
  root = MyGame::Example::CreateArrayTable
                   ((FlatBufferBuilder *)(aStruct.f_ + 1),(ArrayStruct *)local_128);
  FlatBufferBuilderImpl<false>::Finish<MyGame::Example::ArrayTable>
            ((FlatBufferBuilderImpl<false> *)(aStruct.f_ + 1),root,(char *)0x0);
  FlatBufferBuilderImpl<false>::Release
            ((DetachedBuffer *)((long)&s.field_2 + 8),
             (FlatBufferBuilderImpl<false> *)(aStruct.f_ + 1));
  buffer = DetachedBuffer::data((DetachedBuffer *)((long)&s.field_2 + 8));
  type_table = MyGame::Example::ArrayTableTypeTable();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
  FlatBufferToString((string *)local_190,buffer,type_table,false,true,&local_1b0,false);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  val = (char *)std::__cxx11::string::c_str();
  TestEqStr("{ a: { a: 2.0, b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], c: 12, d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], e: 1, f: [ 0, 0 ] } }"
            ,val,
            "\'\"{ \" \"a: { a: 2.0, \" \"b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], \" \"c: 12, \" \"d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, \" \"{ a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], \" \"e: 1, f: [ 0, 0 ] } \" \"}\"\' != \'s.c_str()\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x142,"");
  std::__cxx11::string::~string((string *)local_190);
  DetachedBuffer::~DetachedBuffer((DetachedBuffer *)((long)&s.field_2 + 8));
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)(aStruct.f_ + 1));
  return;
}

Assistant:

void MiniReflectFixedLengthArrayTest() {
  // VS10 does not support typed enums, exclude from tests
#if !defined(_MSC_VER) || _MSC_VER >= 1700
  flatbuffers::FlatBufferBuilder fbb;
  MyGame::Example::ArrayStruct aStruct(2, 12, 1);
  auto aTable = MyGame::Example::CreateArrayTable(fbb, &aStruct);
  fbb.Finish(aTable);

  auto flatbuf = fbb.Release();
  auto s = flatbuffers::FlatBufferToString(
      flatbuf.data(), MyGame::Example::ArrayTableTypeTable());
  TEST_EQ_STR(
      "{ "
      "a: { a: 2.0, "
      "b: [ 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 ], "
      "c: 12, "
      "d: [ { a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] }, "
      "{ a: [ 0, 0 ], b: A, c: [ A, A ], d: [ 0, 0 ] } ], "
      "e: 1, f: [ 0, 0 ] } "
      "}",
      s.c_str());
#endif
}